

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *color,
           LodePNGEncoderSettings *settings)

{
  size_t length;
  byte bVar1;
  uchar filterType;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uchar *puVar14;
  long lVar15;
  ulong uVar16;
  ulong bytewidth;
  uchar *puVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  bool bVar22;
  undefined8 *in_stack_00000008;
  uchar *dummy;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  uchar *local_4f8;
  uchar *local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong auStack_498 [6];
  long alStack_468 [6];
  LodePNGCompressSettings local_438 [21];
  
  uVar3 = getNumColorChannels((LodePNGColorType)color);
  uVar3 = uVar3 * (uint)settings;
  lVar7 = (ulong)(w >> 3) * (ulong)uVar3;
  uVar19 = (ulong)((w & 7) * uVar3 + 7 >> 3);
  length = lVar7 + uVar19;
  bytewidth = (ulong)(uVar3 + 7 >> 3);
  uVar9 = *(uint *)(in_stack_00000008 + 7);
  if ((*(int *)((long)in_stack_00000008 + 0x34) == 0) ||
     (7 < (uint)settings && (LodePNGColorType)color != LCT_PALETTE)) {
    if (uVar3 == 0) {
      return 0x1f;
    }
    if (4 < uVar9) {
      if (3 < uVar9 - 5) {
        return 0x58;
      }
      lVar7 = lVar7 + uVar19 + 1;
      switch(uVar9) {
      case 6:
        lVar11 = 0;
        uVar9 = 0;
        do {
          pvVar4 = malloc(length);
          auStack_498[lVar11] = (ulong)pvVar4;
          if (pvVar4 == (void *)0x0) {
            uVar9 = 0x53;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        if (h != 0 && uVar9 == 0) {
          uVar16 = 0;
          local_4f8 = (uchar *)0x0;
          uVar21 = 0;
          uVar19 = 0;
          puVar14 = out;
          do {
            lVar11 = length * uVar16;
            uVar13 = 0;
            do {
              puVar17 = (uchar *)auStack_498[uVar13];
              filterScanline(puVar17,in + lVar11,local_4f8,length,bytewidth,(uchar)uVar13);
              memset(local_438,0,0x400);
              if (length != 0) {
                uVar6 = 0;
                do {
                  (&local_438[0].btype)[puVar17[uVar6]] = (&local_438[0].btype)[puVar17[uVar6]] + 1;
                  uVar6 = uVar6 + 1;
                } while (length != (uVar6 & 0xffffffff));
              }
              (&local_438[0].btype)[uVar13] = (&local_438[0].btype)[uVar13] + 1;
              lVar12 = 0;
              uVar6 = 0;
              do {
                uVar3 = (&local_438[0].btype)[lVar12];
                uVar10 = (ulong)uVar3;
                if (uVar10 == 0) {
                  lVar18 = 0;
                }
                else {
                  uVar8 = (ulong)(uVar3 >> 0x10);
                  if (0xffff >= uVar3) {
                    uVar8 = uVar10;
                  }
                  lVar15 = (ulong)(0xffff < uVar3) * 0x10;
                  lVar18 = lVar15 + 8;
                  uVar2 = uVar8 >> 8;
                  if (uVar8 < 0x100) {
                    lVar18 = lVar15;
                    uVar2 = uVar8;
                  }
                  lVar15 = lVar18 + 4;
                  uVar8 = uVar2 >> 4;
                  if (uVar2 < 0x10) {
                    lVar15 = lVar18;
                    uVar8 = uVar2;
                  }
                  uVar3 = (uint)(uVar8 >> 2);
                  lVar18 = lVar15 + 2;
                  if (uVar8 < 4) {
                    uVar3 = (uint)uVar8;
                    lVar18 = lVar15;
                  }
                  lVar18 = (lVar18 + 1) - (ulong)(uVar3 < 2);
                  lVar18 = lVar18 * uVar10 + (uVar10 - (uint)(1 << ((byte)lVar18 & 0x1f))) * 2;
                }
                uVar6 = uVar6 + lVar18;
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0x100);
              if (uVar19 < uVar6 || uVar13 == 0) {
                uVar21 = uVar13 & 0xffffffff;
                uVar19 = uVar6;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != 5);
            out[lVar7 * uVar16] = (uchar)uVar21;
            if (length != 0) {
              uVar13 = auStack_498[uVar21];
              uVar6 = 1;
              do {
                puVar14[uVar6] = *(uchar *)((uVar13 - 1) + uVar6);
                uVar10 = uVar6 & 0xffffffff;
                uVar6 = uVar6 + 1;
              } while (length != uVar10);
            }
            uVar16 = uVar16 + 1;
            puVar14 = puVar14 + lVar7;
            local_4f8 = in + lVar11;
          } while (uVar16 != h);
        }
        lVar7 = 0;
        do {
          free((void *)auStack_498[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 5);
        return uVar9;
      case 7:
        local_438[0]._8_8_ = in_stack_00000008[1];
        local_438[0]._16_8_ = in_stack_00000008[2];
        local_438[0].custom_context = (void *)in_stack_00000008[5];
        local_438[0].use_lz77 = (uint)((ulong)*in_stack_00000008 >> 0x20);
        local_438[0].btype = 1;
        local_438[0].custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        local_438[0].custom_deflate =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        lVar11 = 0;
        uVar9 = 0;
        do {
          pvVar4 = malloc(length);
          alStack_468[lVar11] = (long)pvVar4;
          if (pvVar4 == (void *)0x0) {
            uVar9 = 0x53;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        if (h != 0 && uVar9 == 0) {
          local_4a8 = (ulong)h;
          uVar21 = 0;
          uVar3 = 0;
          uVar19 = 0;
          local_4f8 = (uchar *)0x0;
          puVar14 = out;
          do {
            lVar11 = length * uVar21;
            lVar18 = 0;
            lVar12 = 0;
            local_4a0 = uVar21;
            do {
              puVar17 = (uchar *)alStack_468[lVar12];
              filterScanline(puVar17,in + lVar11,local_4f8,length,bytewidth,(uchar)lVar12);
              auStack_498[lVar12] = 0;
              local_4b0 = (uchar *)0x0;
              if (local_438[0].custom_zlib ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress
                          (&local_4b0,(size_t *)((long)auStack_498 + lVar18),puVar17,
                           length & 0xffffffff,local_438);
              }
              else {
                (*local_438[0].custom_zlib)
                          (&local_4b0,(size_t *)((long)auStack_498 + lVar18),puVar17,
                           length & 0xffffffff,local_438);
              }
              free(local_4b0);
              uVar21 = auStack_498[lVar12];
              bVar22 = uVar21 < uVar19;
              if (bVar22 || lVar12 == 0) {
                uVar19 = uVar21;
              }
              if (bVar22 || lVar12 == 0) {
                uVar3 = (uint)lVar12;
              }
              lVar12 = lVar12 + 1;
              lVar18 = lVar18 + 8;
            } while (lVar12 != 5);
            out[lVar7 * local_4a0] = (uchar)uVar3;
            if (length != 0) {
              lVar12 = alStack_468[uVar3];
              uVar21 = 1;
              do {
                puVar14[uVar21] = *(uchar *)(lVar12 + -1 + uVar21);
                uVar16 = uVar21 & 0xffffffff;
                uVar21 = uVar21 + 1;
              } while (length != uVar16);
            }
            uVar21 = local_4a0 + 1;
            puVar14 = puVar14 + lVar7;
            local_4f8 = in + lVar11;
          } while (uVar21 != local_4a8);
        }
        lVar7 = 0;
        do {
          free((void *)alStack_468[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 5);
        return uVar9;
      case 8:
        if (h == 0) {
          return 0;
        }
        puVar17 = out + 1;
        uVar19 = 0;
        puVar14 = (uchar *)0x0;
        do {
          puVar5 = in;
          filterType = *(uchar *)(in_stack_00000008[8] + uVar19);
          puVar17[-1] = filterType;
          filterScanline(puVar17,puVar5,puVar14,length,bytewidth,filterType);
          uVar19 = uVar19 + 1;
          puVar17 = puVar17 + lVar7;
          in = puVar5 + length;
          puVar14 = puVar5;
        } while (h != uVar19);
        return 0;
      }
      lVar11 = 0;
      uVar9 = 0;
      do {
        pvVar4 = malloc(length);
        *(void **)(&local_438[0].btype + lVar11 * 2) = pvVar4;
        if (pvVar4 == (void *)0x0) {
          uVar9 = 0x53;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 5);
      if (h != 0 && uVar9 == 0) {
        uVar21 = 0;
        local_4f8 = (uchar *)0x0;
        bVar20 = 0;
        uVar19 = 0;
        puVar14 = out;
        do {
          lVar11 = length * uVar21;
          lVar12 = 0;
          do {
            puVar17 = *(uchar **)(&local_438[0].btype + lVar12 * 2);
            filterScanline(puVar17,in + lVar11,local_4f8,length,bytewidth,(byte)lVar12);
            if (lVar12 == 0) {
              if (length == 0) goto LAB_00126015;
              uVar13 = 0;
              uVar16 = 0;
              do {
                uVar16 = uVar16 + puVar17[uVar13];
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            else if (length == 0) {
LAB_00126015:
              uVar16 = 0;
            }
            else {
              uVar13 = 0;
              uVar16 = 0;
              do {
                bVar1 = puVar17[uVar13];
                uVar3 = bVar1 ^ 0xff;
                if (-1 < (char)bVar1) {
                  uVar3 = (uint)bVar1;
                }
                uVar16 = uVar16 + uVar3;
                uVar13 = uVar13 + 1;
              } while (length != (uVar13 & 0xffffffff));
            }
            if (uVar16 < uVar19 || lVar12 == 0) {
              bVar20 = (byte)lVar12;
              uVar19 = uVar16;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 5);
          out[lVar7 * uVar21] = bVar20;
          if (length != 0) {
            lVar12 = *(long *)(&local_438[0].btype + (ulong)bVar20 * 2);
            uVar16 = 1;
            do {
              puVar14[uVar16] = *(uchar *)(lVar12 + -1 + uVar16);
              uVar13 = uVar16 & 0xffffffff;
              uVar16 = uVar16 + 1;
            } while (length != uVar13);
          }
          uVar21 = uVar21 + 1;
          puVar14 = puVar14 + lVar7;
          local_4f8 = in + lVar11;
        } while (uVar21 != h);
      }
      lVar7 = 0;
      do {
        free(*(void **)(&local_438[0].btype + lVar7 * 2));
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      return uVar9;
    }
  }
  else {
    uVar9 = 0;
    if (uVar3 == 0) {
      return 0x1f;
    }
  }
  if (h != 0) {
    uVar21 = (ulong)h;
    puVar17 = out + 1;
    puVar14 = (uchar *)0x0;
    do {
      puVar5 = in;
      puVar17[-1] = (uchar)uVar9;
      filterScanline(puVar17,puVar5,puVar14,length,bytewidth,(uchar)uVar9);
      puVar17 = puVar17 + uVar19 + lVar7 + 1;
      uVar21 = uVar21 - 1;
      in = puVar5 + length;
      puVar14 = puVar5;
    } while (uVar21 != 0);
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* color, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(color);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (color->colortype == LCT_PALETTE || color->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum < smallest) {
            bestType = type;
            smallest = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          size_t sum = 0;
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          lodepng_memset(count, 0, 256 * sizeof(*count));
          for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
          ++count[type]; /*the filter type itself is part of the scanline*/
          for(x = 0; x != 256; ++x) {
            sum += ilog2i(count[x]);
          }
          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum > bestSum) {
            bestType = type;
            bestSum = sum;
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings;
    lodepng_memcpy(&zlibsettings, &settings->zlibsettings, sizeof(LodePNGCompressSettings));
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) error = 83; /*alloc fail*/
    }
    if(!error) {
      for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
        for(type = 0; type != 5; ++type) {
          unsigned testsize = (unsigned)linebytes;
          /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
          size[type] = 0;
          dummy = 0;
          zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
          lodepng_free(dummy);
          /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || size[type] < smallest) {
            bestType = type;
            smallest = size[type];
          }
        }
        prevline = &in[y * linebytes];
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}